

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall
pugi::xml_node::insert_copy_before(xml_node *this,xml_node *proto,xml_node *node)

{
  bool bVar1;
  xml_node_type child;
  xml_node_type parent;
  xml_node_struct *p;
  xml_node local_40;
  xml_node n;
  xml_allocator *alloc;
  xml_node_type type_;
  xml_node *node_local;
  xml_node *proto_local;
  xml_node *this_local;
  
  child = type(proto);
  parent = type(this);
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,child);
  if (bVar1) {
    if ((node->_root == (xml_node_struct *)0x0) || (node->_root->parent != this->_root)) {
      xml_node((xml_node *)&this_local);
    }
    else {
      n._root = (xml_node_struct *)
                impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve((xml_allocator *)n._root);
      if (bVar1) {
        p = impl::anon_unknown_0::allocate_node(n._root,child);
        xml_node(&local_40,p);
        bVar1 = operator!(&local_40);
        if (bVar1) {
          xml_node((xml_node *)&this_local);
        }
        else {
          impl::anon_unknown_0::insert_node_before(local_40._root,node->_root);
          impl::anon_unknown_0::node_copy_tree(local_40._root,proto->_root);
          this_local = (xml_node *)local_40._root;
        }
      }
      else {
        xml_node((xml_node *)&this_local);
      }
    }
  }
  else {
    xml_node((xml_node *)&this_local);
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::insert_copy_before(const xml_node& proto, const xml_node& node)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::insert_node_before(n._root, node._root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}